

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::FastInstancesIterator::
~FastInstancesIterator(FastInstancesIterator *this)

{
  int *piVar1;
  NodeAlgorithm *pNVar2;
  uint *puVar3;
  void **ppvVar4;
  TermList *pTVar5;
  IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Rhs_*> *pIVar6;
  ulong uVar7;
  
  pNVar2 = (this->_nodeTypes)._stack;
  if (pNVar2 != (NodeAlgorithm *)0x0) {
    uVar7 = (this->_nodeTypes)._capacity * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar7 == 0) {
      *(undefined8 *)pNVar2 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pNVar2;
    }
    else if (uVar7 < 0x11) {
      *(undefined8 *)pNVar2 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pNVar2;
    }
    else if (uVar7 < 0x19) {
      *(undefined8 *)pNVar2 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pNVar2;
    }
    else if (uVar7 < 0x21) {
      *(undefined8 *)pNVar2 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pNVar2;
    }
    else if (uVar7 < 0x31) {
      *(undefined8 *)pNVar2 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pNVar2;
    }
    else if (uVar7 < 0x41) {
      *(undefined8 *)pNVar2 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pNVar2;
    }
    else {
      operator_delete(pNVar2,0x10);
    }
  }
  puVar3 = (this->_specVarNumbers)._stack;
  if (puVar3 != (uint *)0x0) {
    uVar7 = (this->_specVarNumbers)._capacity * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar7 == 0) {
      *(undefined8 *)puVar3 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puVar3;
    }
    else if (uVar7 < 0x11) {
      *(undefined8 *)puVar3 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = puVar3;
    }
    else if (uVar7 < 0x19) {
      *(undefined8 *)puVar3 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = puVar3;
    }
    else if (uVar7 < 0x21) {
      *(undefined8 *)puVar3 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = puVar3;
    }
    else if (uVar7 < 0x31) {
      *(undefined8 *)puVar3 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = puVar3;
    }
    else if (uVar7 < 0x41) {
      *(undefined8 *)puVar3 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = puVar3;
    }
    else {
      operator_delete(puVar3,0x10);
    }
  }
  ppvVar4 = (this->_alternatives)._stack;
  if (ppvVar4 != (void **)0x0) {
    uVar7 = (this->_alternatives)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar7 == 0) {
      *ppvVar4 = (void *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppvVar4;
    }
    else if (uVar7 < 0x11) {
      *ppvVar4 = (void *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppvVar4;
    }
    else if (uVar7 < 0x19) {
      *ppvVar4 = (void *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppvVar4;
    }
    else if (uVar7 < 0x21) {
      *ppvVar4 = (void *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppvVar4;
    }
    else if (uVar7 < 0x31) {
      *ppvVar4 = (void *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppvVar4;
    }
    else if (uVar7 < 0x41) {
      *ppvVar4 = (void *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppvVar4;
    }
    else {
      operator_delete(ppvVar4,0x10);
    }
  }
  ::Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
            (&(this->_resultDenormalizer)._data);
  ::Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&(this->_subst)._derefBindings);
  ::Lib::
  DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap(&(this->_subst)._bindings);
  pTVar5 = (this->_subst)._boundVars._stack;
  if (pTVar5 != (TermList *)0x0) {
    uVar7 = (this->_subst)._boundVars._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar7 == 0) {
      pTVar5->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pTVar5;
    }
    else if (uVar7 < 0x11) {
      pTVar5->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pTVar5;
    }
    else if (uVar7 < 0x19) {
      pTVar5->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pTVar5;
    }
    else if (uVar7 < 0x21) {
      pTVar5->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pTVar5;
    }
    else if (uVar7 < 0x31) {
      pTVar5->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pTVar5;
    }
    else if (uVar7 < 0x41) {
      pTVar5->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pTVar5;
    }
    else {
      operator_delete(pTVar5,0x10);
    }
  }
  pIVar6 = (this->_ldIterator)._core;
  if (pIVar6 != (IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Rhs_*> *)0x0) {
    piVar1 = &pIVar6->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*pIVar6->_vptr_IteratorCore[1])();
      return;
    }
  }
  return;
}

Assistant:

FastInstancesIterator(FastInstancesIterator&&) = default;